

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::php::(anonymous_namespace)::PhpNamePrefix_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,string_view classname)

{
  string_view name;
  bool bVar1;
  allocator<char> local_45 [20];
  allocator<char> local_31;
  _anonymous_namespace_ *local_30;
  char *local_28;
  _anonymous_namespace_ *local_20;
  string_view classname_local;
  
  local_28 = (char *)classname._M_len;
  name._M_str = local_28;
  name._M_len = (size_t)this;
  local_30 = this;
  local_20 = this;
  classname_local._M_len = (size_t)local_28;
  classname_local._M_str = (char *)__return_storage_ptr__;
  bVar1 = IsReservedName(name);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"PB",&local_31);
    std::allocator<char>::~allocator(&local_31);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,"",local_45)
    ;
    std::allocator<char>::~allocator(local_45);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string PhpNamePrefix(absl::string_view classname) {
  if (IsReservedName(classname)) return "PB";
  return "";
}